

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d8_v4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar21 [32];
  int in_stack_00000008;
  __m256i res_16bit;
  __m256i res_b_round;
  __m256i res_b;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s56;
  __m256i s45;
  __m128i s6;
  __m128i s5;
  __m256i s34;
  __m128i s4;
  __m256i s23;
  __m128i s3;
  __m128i s2;
  uint16_t *data;
  uint32_t i;
  __m256i ff [2];
  __m256i s [4];
  __m256i zero;
  __m256i clip_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  undefined4 local_7c8;
  undefined8 local_7c0;
  undefined8 uStackY_7b8;
  undefined8 uStackY_7b0;
  undefined8 uStackY_7a8;
  undefined1 in_stack_fffffffffffff860 [32];
  __m256i *coeffs;
  __m256i *s_00;
  undefined1 in_stack_fffffffffffff880 [32];
  undefined8 local_690;
  undefined8 uStack_688;
  uint local_624;
  undefined8 uStack_510;
  undefined8 uStack_508;
  ulong local_4a0;
  ulong uStack_478;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_4a0 = SUB168(ZEXT416(7),0);
  auVar22 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar22 = vpinsrd_avx(auVar22,0x40,2);
  auVar22 = vpinsrd_avx(auVar22,0x40,3);
  auVar20 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar20 = vpinsrd_avx(auVar20,0x40,2);
  auVar20 = vpinsrd_avx(auVar20,0x40,3);
  auVar20 = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar20;
  auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
  if (in_stack_00000008 == 10) {
    local_7c8 = 0x3ff;
  }
  else {
    local_7c8 = 0xff;
    if (in_stack_00000008 == 0xc) {
      local_7c8 = 0xfff;
    }
  }
  auVar5 = vpinsrw_avx(ZEXT216((ushort)local_7c8),local_7c8,1);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,2);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,3);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,4);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,5);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,6);
  auVar5 = vpinsrw_avx(auVar5,local_7c8,7);
  auVar6 = vpinsrw_avx(ZEXT216((ushort)local_7c8),local_7c8,1);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,2);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,3);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,4);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,5);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,6);
  auVar6 = vpinsrw_avx(auVar6,local_7c8,7);
  uStack_70 = auVar6._0_8_;
  uStack_68 = auVar6._8_8_;
  uStack_478 = SUB328(ZEXT832(0),4);
  pack_filters_4tap(in_stack_fffffffffffff860._8_8_,in_stack_fffffffffffff860._0_8_);
  pauVar1 = (undefined1 (*) [16])(in_RDI + in_RSI * 4);
  pauVar2 = (undefined1 (*) [16])(in_RDI + in_RSI * 6);
  puVar3 = (undefined8 *)(in_RDI + in_RSI * 8);
  local_690 = *puVar3;
  uStack_688 = puVar3[1];
  auVar7._16_8_ = *(undefined8 *)*pauVar2;
  auVar7._0_16_ = *pauVar1;
  auVar7._24_8_ = *(undefined8 *)(*pauVar2 + 8);
  auVar21._16_8_ = local_690;
  auVar21._0_16_ = *pauVar2;
  auVar21._24_8_ = uStack_688;
  vpunpcklwd_avx2(auVar7,auVar21);
  auVar15._16_8_ = *(undefined8 *)*pauVar2;
  auVar15._0_16_ = *pauVar1;
  auVar15._24_8_ = *(undefined8 *)(*pauVar2 + 8);
  auVar14._16_8_ = local_690;
  auVar14._0_16_ = *pauVar2;
  auVar14._24_8_ = uStack_688;
  vpunpckhwd_avx2(auVar15,auVar14);
  for (local_624 = 0; local_624 < in_R8D; local_624 = local_624 + 2) {
    lVar4 = in_RDI + (ulong)local_624 * in_RSI * 2;
    pauVar1 = (undefined1 (*) [16])(lVar4 + in_RSI * 10);
    puVar3 = (undefined8 *)(lVar4 + in_RSI * 0xc);
    uVar8 = *puVar3;
    uVar9 = puVar3[1];
    auVar11._8_8_ = uStack_688;
    auVar11._0_8_ = local_690;
    auVar11._16_8_ = *(undefined8 *)*pauVar1;
    auVar11._24_8_ = *(undefined8 *)(*pauVar1 + 8);
    auVar10._16_8_ = uVar8;
    auVar10._0_16_ = *pauVar1;
    auVar10._24_8_ = uVar9;
    vpunpcklwd_avx2(auVar11,auVar10);
    auVar13._8_8_ = uStack_688;
    auVar13._0_8_ = local_690;
    auVar13._16_8_ = *(undefined8 *)*pauVar1;
    auVar13._24_8_ = *(undefined8 *)(*pauVar1 + 8);
    auVar12._16_8_ = uVar8;
    auVar12._0_16_ = *pauVar1;
    auVar12._24_8_ = uVar9;
    auVar21 = vpunpckhwd_avx2(auVar13,auVar12);
    s_00 = in_stack_fffffffffffff880._16_8_;
    coeffs = in_stack_fffffffffffff880._8_8_;
    convolve_4tap(s_00,coeffs);
    uStack_508 = auVar22._8_8_;
    uStack_510 = auVar22._0_8_;
    auVar18._16_8_ = uStack_510;
    auVar18._0_16_ = auVar20;
    auVar18._24_8_ = uStack_508;
    auVar21 = vpaddd_avx2(auVar21,auVar18);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_4a0;
    auVar7 = vpsrad_avx2(auVar21,auVar16);
    in_stack_fffffffffffff880 = auVar7;
    convolve_4tap(s_00,coeffs);
    auVar17._16_8_ = uStack_510;
    auVar17._0_16_ = auVar20;
    auVar17._24_8_ = uStack_508;
    auVar21 = vpaddd_avx2(in_stack_fffffffffffff880,auVar17);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_4a0;
    auVar21 = vpsrad_avx2(auVar21,auVar6);
    auVar21 = vpackssdw_avx2(auVar7,auVar21);
    auVar19._16_8_ = uStack_70;
    auVar19._0_16_ = auVar5;
    auVar19._24_8_ = uStack_68;
    auVar21 = vpminsw_avx2(auVar21,auVar19);
    auVar21 = vpmaxsw_avx2(auVar21,ZEXT832(uStack_478) << 0x40);
    puVar3 = (undefined8 *)(in_RDX + (ulong)local_624 * in_RCX * 2);
    local_7c0 = auVar21._0_8_;
    uStackY_7b8 = auVar21._8_8_;
    uStackY_7b0 = auVar21._16_8_;
    uStackY_7a8 = auVar21._24_8_;
    *puVar3 = local_7c0;
    puVar3[1] = uStackY_7b8;
    puVar3 = (undefined8 *)(in_RDX + ((ulong)local_624 * in_RCX + in_RCX) * 2);
    *puVar3 = uStackY_7b0;
    puVar3[1] = uStackY_7a8;
    local_690 = uVar8;
    uStack_688 = uVar9;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();
  __m256i s[4], ff[2];
  uint32_t i;
  pack_filters_4tap(filter, ff);

  const uint16_t *data = src_ptr;
  /* Vertical filter */
  {
    __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_pitch));
    __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_pitch));

    __m256i s23 = _mm256_inserti128_si256(_mm256_castsi128_si256(s2), s3, 1);

    __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_pitch));

    __m256i s34 = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s4, 1);

    s[0] = _mm256_unpacklo_epi16(s23, s34);
    s[2] = _mm256_unpackhi_epi16(s23, s34);

    for (i = 0; i < height; i += 2) {
      data = &src_ptr[i * src_pitch];

      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_pitch));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_pitch));

      __m256i s45 = _mm256_inserti128_si256(_mm256_castsi128_si256(s4), s5, 1);
      __m256i s56 = _mm256_inserti128_si256(_mm256_castsi128_si256(s5), s6, 1);

      s[1] = _mm256_unpacklo_epi16(s45, s56);
      s[3] = _mm256_unpackhi_epi16(s45, s56);

      const __m256i res_a = convolve_4tap(s, ff);

      __m256i res_a_round = _mm256_sra_epi32(
          _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

      const __m256i res_b = convolve_4tap(s + 2, ff);
      __m256i res_b_round = _mm256_sra_epi32(
          _mm256_add_epi32(res_b, round_const_bits), round_shift_bits);

      __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
      res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
      res_16bit = _mm256_max_epi16(res_16bit, zero);

      _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch],
                       _mm256_castsi256_si128(res_16bit));
      _mm_storeu_si128((__m128i *)&dst_ptr[i * dst_pitch + dst_pitch],
                       _mm256_extracti128_si256(res_16bit, 1));

      s[0] = s[1];
      s[2] = s[3];
      s4 = s6;
    }
  }
}